

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O3

SoapySDRKwargs * toKwargs(SoapySDRKwargs *__return_storage_ptr__,Kwargs *args)

{
  _Rb_tree_node_base *p_Var1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  _Rb_tree_node_base *p_Var3;
  undefined8 *puVar4;
  
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->keys = (char **)0x0;
  __return_storage_ptr__->vals = (char **)0x0;
  p_Var3 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (_Rb_tree_node_base *)CONCAT44(in_register_00000004,in_EAX);
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(args->_M_t)._M_impl.super__Rb_tree_header) {
      return (SoapySDRKwargs *)p_Var1;
    }
    iVar2 = SoapySDRKwargs_set(__return_storage_ptr__,*(char **)(p_Var3 + 1),*(char **)(p_Var3 + 2))
    ;
    if (iVar2 != 0) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    p_Var1 = p_Var3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = __cxa_init_primary_exception;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static inline SoapySDRKwargs toKwargs(const SoapySDR::Kwargs &args)
{
    SoapySDRKwargs out;
    std::memset(&out, 0, sizeof(out));
    for (const auto &it : args)
    {
        if (SoapySDRKwargs_set(&out, it.first.c_str(), it.second.c_str()) != 0)
        {
            throw std::bad_alloc();
        }
    }
    return out;
}